

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int SendDataMDMx(MDM *pMDM,uchar *buf,int buflen,int *pSentBytes)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (pMDM->InternalBufferSize < buflen) {
    pcVar3 = "Too many data to send at once. ";
  }
  else {
    iVar1 = WriteRS232Port(&pMDM->RS232Port,buf,buflen,pSentBytes);
    if (iVar1 == 0) {
      return 0;
    }
    pcVar3 = "Error sending data with a MDM. ";
  }
  pcVar2 = strtime_m();
  printf("SendDataMDM error (%s) : %s(pMDM=%#x)\n",pcVar2,pcVar3,(ulong)pMDM & 0xffffffff);
  return 1;
}

Assistant:

HARDWAREX_API int SendDataMDMx(MDM* pMDM, unsigned char* buf, int buflen, int* pSentBytes)
{
	return SendDataMDM(pMDM, buf, buflen, pSentBytes);
}